

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_stor_resp(Curl_easy *data,int ftpcode,ftpstate instate)

{
  CURLcode CVar1;
  _Bool local_39;
  anon_union_280_8_fcbf97e8_for_proto *paStack_38;
  _Bool connected;
  ftp_conn *ftpc;
  connectdata *conn;
  ftpstate local_1d;
  CURLcode result;
  ftpstate instate_local;
  Curl_easy *pCStack_18;
  int ftpcode_local;
  Curl_easy *data_local;
  
  conn._4_4_ = 0;
  ftpc = (ftp_conn *)data->conn;
  local_1d = instate;
  result = ftpcode;
  pCStack_18 = data;
  if (399 < ftpcode) {
    Curl_failf(data,"Failed FTP upload: %0d",(ulong)(uint)ftpcode);
    _ftp_state(pCStack_18,'\0');
    return CURLE_UPLOAD_FAILED;
  }
  (((connectdata *)ftpc)->proto).ftpc.state_saved = instate;
  if ((*(ulong *)&(data->set).field_0x89c >> 0xf & 1) != 0) {
    paStack_38 = &((connectdata *)ftpc)->proto;
    _ftp_state(data,'\0');
    conn._4_4_ = Curl_conn_connect(pCStack_18,1,false,&local_39);
    if (conn._4_4_ != CURLE_OK) {
      return conn._4_4_;
    }
    if ((local_39 & 1U) == 0) {
      if (((pCStack_18 != (Curl_easy *)0x0) &&
          ((*(ulong *)&(pCStack_18->set).field_0x89c >> 0x1e & 1) != 0)) &&
         (((pCStack_18->state).feat == (curl_trc_feat *)0x0 ||
          (0 < ((pCStack_18->state).feat)->log_level)))) {
        Curl_infof(pCStack_18,"Data conn was not available immediately");
      }
      *(byte *)((long)paStack_38 + 0x112) = *(byte *)((long)paStack_38 + 0x112) & 0xdf | 0x20;
      CVar1 = ftp_check_ctrl_on_data_wait(pCStack_18);
      return CVar1;
    }
    *(byte *)((long)paStack_38 + 0x112) = *(byte *)((long)paStack_38 + 0x112) & 0xdf;
  }
  conn._4_4_ = 0;
  CVar1 = InitiateTransfer(pCStack_18);
  return CVar1;
}

Assistant:

static CURLcode ftp_state_stor_resp(struct Curl_easy *data,
                                    int ftpcode, ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;

  if(ftpcode >= 400) {
    failf(data, "Failed FTP upload: %0d", ftpcode);
    ftp_state(data, FTP_STOP);
    /* oops, we never close the sockets! */
    return CURLE_UPLOAD_FAILED;
  }

  conn->proto.ftpc.state_saved = instate;

  /* PORT means we are now awaiting the server to connect to us. */
  if(data->set.ftp_use_port) {
    struct ftp_conn *ftpc = &conn->proto.ftpc;
    bool connected;

    ftp_state(data, FTP_STOP); /* no longer in STOR state */

    result = Curl_conn_connect(data, SECONDARYSOCKET, FALSE, &connected);
    if(result)
      return result;

    if(!connected) {
      infof(data, "Data conn was not available immediately");
      ftpc->wait_data_conn = TRUE;
      return ftp_check_ctrl_on_data_wait(data);
    }
    ftpc->wait_data_conn = FALSE;
  }
  return InitiateTransfer(data);
}